

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

int buf_read(char *pathname,char **buf,int *len)

{
  int __fd;
  char *pcVar1;
  ssize_t sVar2;
  size_t real_size;
  undefined1 local_b8 [4];
  int fd;
  stat sb;
  int *len_local;
  char **buf_local;
  char *pathname_local;
  
  *buf = (char *)0x0;
  *len = 0;
  sb.__glibc_reserved[2] = (__syscall_slong_t)len;
  __fd = open(pathname,0);
  if (__fd < 1) {
    pathname_local._4_4_ = -1;
  }
  else {
    memset(local_b8,0,0x90);
    fstat(__fd,(stat *)local_b8);
    *(undefined4 *)sb.__glibc_reserved[2] = (undefined4)sb.st_rdev;
    pcVar1 = (char *)malloc((long)(*(int *)sb.__glibc_reserved[2] + 2));
    *buf = pcVar1;
    sVar2 = read(__fd,*buf,(long)*(int *)sb.__glibc_reserved[2]);
    (*buf)[sVar2] = '\0';
    (*buf)[sVar2 + 1] = '\0';
    *(int *)sb.__glibc_reserved[2] = (int)sVar2;
    close(__fd);
    pathname_local._4_4_ = *(int *)sb.__glibc_reserved[2];
  }
  return pathname_local._4_4_;
}

Assistant:

int buf_read(const char *pathname, char **buf, int *len) {
  struct stat sb;
  int fd;
  size_t real_size;

  *buf = 0;
  *len = 0;
  fd = open(pathname, O_RDONLY);
  if (fd <= 0) return -1;
  memset(&sb, 0, sizeof(sb));
  fstat(fd, &sb);
  *len = sb.st_size;
  *buf = (char *)MALLOC(*len + 2);
  /* MINGW likes to convert cr lf => lf which messes with the size */
  real_size = read(fd, *buf, *len);
  (*buf)[real_size] = 0;
  (*buf)[real_size + 1] = 0;
  *len = real_size;
  close(fd);
  return *len;
}